

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitArrayNew(BinaryInstWriter *this,ArrayNew *curr)

{
  WasmBinaryWriter *this_00;
  HeapType type;
  size_t in_RCX;
  void *__buf;
  LEB<unsigned_int,_unsigned_char> *this_01;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_19;
  
  local_19 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  if (curr->init == (Expression *)0x0) {
    this_01 = &local_20;
    local_20.value = 7;
  }
  else {
    this_01 = &local_24;
    local_24.value = 6;
  }
  LEB<unsigned_int,_unsigned_char>::write(this_01,(int)this->o,__buf,in_RCX);
  this_00 = this->parent;
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.
                     type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNew(ArrayNew* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->isWithDefault()) {
    o << U32LEB(BinaryConsts::ArrayNewDefault);
  } else {
    o << U32LEB(BinaryConsts::ArrayNew);
  }
  parent.writeIndexedHeapType(curr->type.getHeapType());
}